

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionDetails::OptionDetails
          (OptionDetails *this,string *short_,string *long_,String *desc,
          shared_ptr<const_cxxopts::Value> *val)

{
  shared_ptr<const_cxxopts::Value> *val_local;
  String *desc_local;
  string *long__local;
  string *short__local;
  OptionDetails *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)short_);
  std::__cxx11::string::string((string *)&this->m_long,(string *)long_);
  std::__cxx11::string::string((string *)&this->m_desc,(string *)desc);
  std::shared_ptr<const_cxxopts::Value>::shared_ptr(&this->m_value,val);
  this->m_count = 0;
  return;
}

Assistant:

OptionDetails
    (
      const std::string& short_,
      const std::string& long_,
      const String& desc,
      std::shared_ptr<const Value> val
    )
    : m_short(short_)
    , m_long(long_)
    , m_desc(desc)
    , m_value(val)
    , m_count(0)
    {
    }